

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-get-attr.c
# Opt level: O2

void print_attr(BigAttr *attr,int brief)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  char *data;
  char local_c8 [8];
  char buffer [128];
  
  data = attr->data;
  if ((brief == 0) || (longfmt != 0)) {
    printf("%-20s %s %3d  ",attr->name,attr->dtype);
    printf("[ ");
  }
  for (iVar3 = 0; iVar3 < attr->nmemb; iVar3 = iVar3 + 1) {
    if ((iVar3 == attr->nmemb + -1) || (pcVar2 = " ", attr->dtype[1] == 'S')) {
      pcVar2 = "";
    }
    big_file_dtype_format(local_c8,attr->dtype,data,(char *)0x0);
    printf("%s%s",local_c8,pcVar2);
    iVar1 = big_file_dtype_itemsize(attr->dtype);
    data = data + iVar1;
  }
  if ((brief == 0) || (longfmt != 0)) {
    printf(" ]");
  }
  putchar(10);
  return;
}

Assistant:

static void print_attr(BigAttr * attr, int brief) {
    char buffer[128];
    char * data = attr->data;
    int i;
    if(!brief || longfmt) {
        printf("%-20s %s %3d  ", attr->name, attr->dtype, attr->nmemb);
        printf("[ ");
    }
    for(i = 0; i < attr->nmemb; i ++) {
        char * endl;
        if(i != attr->nmemb - 1 && attr->dtype[1] != 'S') {
            endl = " ";
        } else {
            endl = "";
        }
        big_file_dtype_format(buffer, attr->dtype, data, NULL);
        printf("%s%s", buffer, endl);
        data += dtype_itemsize(attr->dtype);
    }
    if(!brief || longfmt) {
        printf(" ]");
    }
    printf("\n");
}